

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

wchar_t * __thiscall ON_wString::ReserveArray(ON_wString *this,size_t array_capacity)

{
  ON_Internal_Empty_wString *hdr;
  void *pvVar1;
  wchar_t *pwVar2;
  ON_Internal_Empty_wString *pOVar3;
  wchar_t capacity;
  
  if (array_capacity != 0) {
    if (array_capacity < 0xffffffff) {
      pwVar2 = this->m_s;
      hdr = (ON_Internal_Empty_wString *)(pwVar2 + -3);
      capacity = (wchar_t)array_capacity;
      if (hdr == &empty_wstring || pwVar2 == (wchar_t *)0x0) {
        CreateArray(this,capacity);
      }
      else if ((hdr->header).ref_count.super___atomic_base<int>._M_i < 2) {
        if (pwVar2[-1] < capacity) {
          pvVar1 = onrealloc(hdr,(long)(int)((long)capacity + 1) * 4 + 0xc);
          this->m_s = (wchar_t *)((long)pvVar1 + 0xc);
          memset((void *)((long)pvVar1 + (long)*(int *)((long)pvVar1 + 8) * 4 + 0xc),0,
                 (((long)capacity + 1) - (long)*(int *)((long)pvVar1 + 8)) * 4);
          *(wchar_t *)((long)pvVar1 + 8) = capacity;
        }
      }
      else {
        this->m_s = (wchar_t *)0x84a45c;
        CreateArray(this,capacity);
        if (pwVar2[-2] < capacity) {
          capacity = pwVar2[-2];
        }
        if (L'\0' < capacity) {
          pOVar3 = (ON_Internal_Empty_wString *)(this->m_s + -3);
          if (this->m_s == (wchar_t *)0x0) {
            pOVar3 = &empty_wstring;
          }
          memcpy(&pOVar3->s,pwVar2,(ulong)(uint)capacity << 2);
          (pOVar3->header).string_length = capacity;
        }
        ON_wStringHeader_DecrementRefCountAndDeleteIfZero((ON_wStringHeader *)hdr);
      }
      pwVar2 = Array(this);
      return pwVar2;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_wstring.cpp"
               ,0x1aa,"","Requested capacity > ON_wString::MaximumStringLength");
  }
  return (wchar_t *)0x0;
}

Assistant:

wchar_t* ON_wString::ReserveArray( size_t array_capacity )
{
  if (array_capacity <= 0)
    return nullptr;

  if (array_capacity > (size_t)ON_wString::MaximumStringLength)
  {
    ON_ERROR("Requested capacity > ON_wString::MaximumStringLength");
    return nullptr;
  }

  const int capacity = (int)array_capacity; // for 64 bit compiler
  ON_wStringHeader* hdr0 = Header();
  if ( hdr0 == pEmptyStringHeader || nullptr == hdr0 )
  {
		CreateArray(capacity);
  }
  else if ( (int)(hdr0->ref_count) > 1 )
  {
    // Calling Create() here insures hdr0 remains valid until we decrement below.
    Create();

    // Allocate a new array
		CreateArray(capacity);
    ON_wStringHeader* hdr1 = Header();
    const int size = (capacity < hdr0->string_length) ? capacity : hdr0->string_length;
    if ( size > 0 )
    {
      memcpy( hdr1->string_array(), hdr0->string_array(), size*sizeof(*m_s) );
      hdr1->string_length = size;
    }
    // "this" no longer requires access to the original header
    // If we are in a multi-threaded situation and another thread
    // has decremented ref_count since the > 1 check above,
    // we might end up deleting hdr0.
    ON_wStringHeader_DecrementRefCountAndDeleteIfZero(hdr0);
  }
	else if ( capacity > hdr0->string_capacity )
  {
		hdr0 = (ON_wStringHeader*)onrealloc( hdr0, sizeof(ON_wStringHeader) + (capacity+1)*sizeof(*m_s) );
    m_s = hdr0->string_array();
    memset( &m_s[hdr0->string_capacity], 0, (1 + capacity - hdr0->string_capacity)*sizeof(*m_s) );
    hdr0->string_capacity = capacity;
	}
  return Array();
}